

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O0

void al_register_event_source(ALLEGRO_EVENT_QUEUE *queue,ALLEGRO_EVENT_SOURCE *source)

{
  _Bool _Var1;
  undefined8 *puVar2;
  _AL_VECTOR *in_RSI;
  ALLEGRO_EVENT_QUEUE *in_RDI;
  ALLEGRO_EVENT_SOURCE **slot;
  _AL_VECTOR *in_stack_ffffffffffffffe8;
  
  _Var1 = _al_vector_contains(in_RSI,in_stack_ffffffffffffffe8);
  if (!_Var1) {
    _al_event_source_on_registration_to_queue((ALLEGRO_EVENT_SOURCE *)slot,in_RDI);
    _al_mutex_lock((_AL_MUTEX *)0x1741ae);
    puVar2 = (undefined8 *)_al_vector_alloc_back(in_stack_ffffffffffffffe8);
    *puVar2 = in_RSI;
    _al_mutex_unlock((_AL_MUTEX *)0x1741d6);
  }
  return;
}

Assistant:

void al_register_event_source(ALLEGRO_EVENT_QUEUE *queue,
   ALLEGRO_EVENT_SOURCE *source)
{
   ALLEGRO_EVENT_SOURCE **slot;
   ASSERT(queue);
   ASSERT(source);

   if (!_al_vector_contains(&queue->sources, &source)) {
      _al_event_source_on_registration_to_queue(source, queue);
      _al_mutex_lock(&queue->mutex);
      slot = _al_vector_alloc_back(&queue->sources);
      *slot = source;
      _al_mutex_unlock(&queue->mutex);
   }
}